

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O1

xml_node<char> * __thiscall
rapidxml::xml_node<char>::first_node
          (xml_node<char> *this,char *name,size_t name_size,bool case_sensitive)

{
  byte *pbVar1;
  char *pcVar2;
  byte bVar3;
  byte *pbVar4;
  xml_node<char> *pxVar5;
  byte *pbVar6;
  char *end;
  bool bVar7;
  
  if (name == (char *)0x0) {
    pxVar5 = this->m_first_node;
  }
  else {
    if (name_size == 0) {
      pbVar4 = (byte *)0xffffffffffffffff;
      do {
        name_size = (size_t)(pbVar4 + 1);
        pcVar2 = name + 1 + (long)pbVar4;
        pbVar4 = (byte *)name_size;
      } while (*pcVar2 != '\0');
    }
    pxVar5 = this->m_first_node;
    if (pxVar5 != (xml_node<char> *)0x0) {
      do {
        pbVar4 = (byte *)(pxVar5->super_xml_base<char>).m_name;
        pbVar6 = pbVar4;
        if (pbVar4 == (byte *)0x0) {
          pbVar6 = &xml_base<char>::nullstr()::zero;
        }
        if (pbVar4 != (byte *)0x0) {
          pbVar4 = (byte *)(pxVar5->super_xml_base<char>).m_name_size;
        }
        if (pbVar4 == (byte *)name_size) {
          pbVar1 = pbVar6 + (long)pbVar4;
          bVar7 = 0 < (long)pbVar4;
          if (case_sensitive) {
            if ((long)pbVar4 < 1) {
              return pxVar5;
            }
            pbVar4 = (byte *)(name + 1);
            if (*pbVar6 == *name) {
              do {
                pbVar6 = pbVar6 + 1;
                bVar7 = pbVar6 < pbVar1;
                if (!bVar7) {
                  return pxVar5;
                }
                bVar3 = *pbVar4;
                pbVar4 = pbVar4 + 1;
              } while (*pbVar6 == bVar3);
            }
          }
          else {
            if ((long)pbVar4 < 1) {
              return pxVar5;
            }
            pbVar4 = (byte *)(name + 1);
            if (internal::lookup_tables<0>::lookup_upcase[*pbVar6] ==
                internal::lookup_tables<0>::lookup_upcase[(byte)*name]) {
              do {
                pbVar6 = pbVar6 + 1;
                bVar7 = pbVar6 < pbVar1;
                if (!bVar7) {
                  return pxVar5;
                }
                bVar3 = *pbVar4;
                pbVar4 = pbVar4 + 1;
              } while (internal::lookup_tables<0>::lookup_upcase[*pbVar6] ==
                       internal::lookup_tables<0>::lookup_upcase[bVar3]);
            }
          }
          if (!bVar7) {
            return pxVar5;
          }
        }
        if ((pxVar5->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) {
          __assert_fail("this->m_parent",
                        "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/arbiter/third/xml/rapidxml.hpp"
                        ,0x406,
                        "xml_node<Ch> *rapidxml::xml_node<>::next_sibling(const Ch *, std::size_t, bool) const [Ch = char]"
                       );
        }
        pxVar5 = pxVar5->m_next_sibling;
      } while (pxVar5 != (xml_node<char> *)0x0);
    }
  }
  return pxVar5;
}

Assistant:

xml_node<Ch> *first_node(const Ch *name = 0, std::size_t name_size = 0, bool case_sensitive = true) const
        {
            if (name)
            {
                if (name_size == 0)
                    name_size = internal::measure(name);
                for (xml_node<Ch> *child = m_first_node; child; child = child->next_sibling())
                    if (internal::compare(child->name(), child->name_size(), name, name_size, case_sensitive))
                        return child;
                return 0;
            }
            else
                return m_first_node;
        }